

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMDataProviders.cpp
# Opt level: O0

SilenceDataProvider * __thiscall
ASDCP::SilenceDataProvider::PutSample
          (SilenceDataProvider *this,ui32_t numChannels,byte_t *buf,ui32_t *bytesWritten)

{
  ILogSink *this_00;
  undefined4 in_register_00000034;
  long lVar1;
  uint *in_R8;
  ui32_t *bytesWritten_local;
  byte_t *buf_local;
  ui32_t numChannels_local;
  SilenceDataProvider *this_local;
  
  lVar1 = CONCAT44(in_register_00000034,numChannels);
  if (bytesWritten == (ui32_t *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else if (*(uint *)(lVar1 + 0x1c) < (uint)buf) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"Requested %u channels from a wav file with %u channel.",
               (ulong)buf & 0xffffffff,(ulong)*(uint *)(lVar1 + 0x1c));
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
  else {
    *in_R8 = *(int *)(lVar1 + 0x38) * (uint)buf;
    memset(bytesWritten,0,(ulong)*in_R8);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  return this;
}

Assistant:

Result_t
ASDCP::SilenceDataProvider::PutSample(const ui32_t numChannels, byte_t* buf, ui32_t* bytesWritten)
{
  ASDCP_TEST_NULL(buf);
  if ( numChannels > m_ADesc.ChannelCount)
  {
    DefaultLogSink().Error("Requested %u channels from a wav file with %u channel.", numChannels,
                           m_ADesc.ChannelCount);
    return RESULT_FAIL;
  }
  (*bytesWritten) = m_SampleSize * numChannels;
  ::memset(buf, 0, (*bytesWritten));
  return RESULT_OK;
}